

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

char * __thiscall sznet::net::TcpConnection::stateToString(TcpConnection *this)

{
  char *pcVar1;
  
  if ((ulong)this->m_state < 4) {
    pcVar1 = &DAT_001519a0 + *(int *)(&DAT_001519a0 + (ulong)this->m_state * 4);
  }
  else {
    pcVar1 = "unknown state";
  }
  return pcVar1;
}

Assistant:

const char* TcpConnection::stateToString() const
{
	switch (m_state)
	{
	case kDisconnected:
		return "kDisconnected";
	case kConnecting:
		return "kConnecting";
	case kConnected:
		return "kConnected";
	case kDisconnecting:
		return "kDisconnecting";
	default:
		return "unknown state";
	}
}